

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

void interface_exec(_func_void_void_ptr *idle_proc,void *idle_data)

{
  short *psVar1;
  undefined4 uVar2;
  pointer pcVar3;
  Player *pPVar4;
  FILE *__stream;
  size_type sVar5;
  _func_void_void_ptr *p_Var6;
  void *pvVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  Player_Type PVar12;
  uint uVar13;
  File_Selection_Code FVar14;
  long lVar15;
  char *pcVar16;
  _Head_base<0UL,_Player_*,_false> _Var17;
  long lVar18;
  undefined8 uVar19;
  Midi_Program_Ex *pMVar20;
  WINDOW *pWVar21;
  long *plVar22;
  undefined8 uVar23;
  size_type *psVar24;
  Midi_Spec spec;
  ulong uVar25;
  string *psVar26;
  undefined1 *puVar27;
  char *in_R8;
  char *in_R9;
  Program *pPVar28;
  short sVar29;
  int in_stack_ffffffffffffed08;
  string sStack_12f0;
  _Head_base<0UL,__win_st_*,_false> _Stack_12d0;
  long lStack_12c8;
  _func_void_void_ptr *p_Stack_12c0;
  IniProcessingVariant IStack_12b8;
  void *pvStack_1288;
  char *pcStack_1280;
  uint uStack_1278;
  char acStack_1270 [16];
  double dStack_1260;
  undefined1 auStack_1258 [256];
  _Alloc_hider _Stack_1158;
  size_type sStack_1150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1148;
  bool bStack_1138;
  uint uStack_1134;
  undefined4 uStack_1130;
  undefined4 uStack_112c;
  undefined4 uStack_1128;
  undefined4 uStack_1124;
  string sStack_1120;
  time_t tStack_1100;
  undefined5 uStack_10f8;
  undefined3 uStack_10f3;
  uint uStack_10f0;
  bool bStack_10ec;
  Midi_Spec MStack_10e8;
  undefined4 uStack_10e4;
  char *pcStack_10e0;
  _Head_base<0UL,_char_*,_false> _Stack_10d8;
  undefined8 uStack_10d0;
  _func_void_void_ptr *p_Stack_10c8;
  void *pvStack_10c0;
  string sStack_10b8;
  undefined1 *apuStack_1098 [2];
  undefined1 auStack_1088 [16];
  undefined1 *apuStack_1078 [2];
  undefined1 auStack_1068 [16];
  undefined1 *apuStack_1058 [2];
  undefined1 auStack_1048 [16];
  undefined1 auStack_1038 [16];
  undefined1 auStack_1028 [24];
  _Head_base<0UL,__win_st_*,_false> _Stack_1010;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1008;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_ff8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_fe8;
  bool bStack_fd8;
  __uniq_ptr_impl<_win_st,_WINDOW_deleter> _Stack_f60;
  __uniq_ptr_impl<_win_st,_WINDOW_deleter> _Stack_f58;
  __uniq_ptr_impl<_win_st,_WINDOW_deleter> _Stack_f50;
  __uniq_ptr_impl<_win_st,_WINDOW_deleter> _Stack_f48;
  
  if (arg_simple_interface) {
    if (interrupted_by_signal == '\0') {
      interface_exec();
    }
    __stream = _stderr;
    uVar23 = gettext("Interrupted.");
    fprintf(__stream,"%s\n",uVar23);
    return;
  }
  p_Stack_12c0 = idle_proc;
  pvStack_1288 = idle_data;
  initscr();
  auStack_1258[0] = false;
  auStack_1258._8_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  auStack_1258._16_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  auStack_1258._24_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  auStack_1258._32_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  auStack_1258._40_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  auStack_1258._48_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  auStack_1258._56_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  auStack_1258._64_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  auStack_1258._72_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  lVar15 = 0x50;
  do {
    *(undefined8 *)(auStack_1258 + lVar15) = 0;
    lVar15 = lVar15 + 8;
  } while (lVar15 != 0x60);
  lVar15 = 0x60;
  do {
    *(undefined8 *)(auStack_1258 + lVar15) = 0;
    lVar15 = lVar15 + 8;
  } while (lVar15 != 0xe0);
  _Stack_1158._M_p = (pointer)&aStack_1148;
  auStack_1258._240_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  auStack_1258._248_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  auStack_1258._224_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  auStack_1258._232_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  sStack_1150 = 0;
  aStack_1148._M_local_buf[0] = '\0';
  bStack_1138 = false;
  sStack_1120._M_dataplus._M_p = (pointer)&sStack_1120.field_2;
  uStack_1134 = 0;
  uStack_1130 = 0;
  uStack_112c = 0;
  uStack_1128 = 0;
  uStack_1124 = 0;
  sStack_1120._M_string_length = 0;
  sStack_1120.field_2._M_local_buf[0] = '\0';
  MStack_10e8 = GM;
  uStack_10d0._0_4_ = 0;
  uStack_10d0._4_4_ = 0;
  pcStack_10e0 = (char *)0x0;
  _Stack_10d8._M_head_impl = (char *)0x0;
  tStack_1100 = 0;
  uStack_10f8 = 0;
  uStack_10f3 = 0;
  uStack_10f0 = 0;
  bStack_10ec = false;
  p_Stack_10c8 = p_Stack_12c0;
  pvStack_10c0 = pvStack_1288;
  cVar8 = has_colors();
  if (cVar8 != '\0') {
    start_color();
    cVar8 = can_change_color();
    if (cVar8 != '\0') {
      init_color(0,0xb4,0xcb,0xd3);
      init_color(1,800,0,0);
      init_color(2,0x131,0x25b,0x17);
      init_color(3,0x300,0x273,0);
      init_color(4,0xcb,0x18c,0x283);
      init_color(5,0x1ca,0x139,0x1e2);
      init_color(6,0x17,0x254,0x25b);
      init_color(7,0x33b,0x34b,0x32b);
      init_color(8,0x14d,0x155,0x145);
      init_color(9,0x3a9,0xa0,0xa0);
      init_color(10,0x21d,0x376,0xcb);
      init_color(0xb,0x3c0,0x1da,0);
      init_color(0xc,0x1bf,0x26f,0x32b);
      init_color(0xd,0x2a6,0x1f2,0x292);
      init_color(0xe,0xcb,0x376,0x376);
      init_color(0xf,0x3a5,0x3a5,0x39d);
    }
    init_pair(1,7,0);
    init_pair(2,3,0);
    init_pair(3,0,7);
    init_pair(4,4,0);
    init_pair(5,2,0);
    init_pair(6,0,7);
    init_pair(7,4,0);
    init_pair(8,5,0);
    sVar29 = 9;
    lVar15 = 0;
    do {
      uVar13 = *(uint *)((long)&DAT_00198360 + lVar15);
      init_color((int)(short)(sVar29 + 7),(ulong)((uVar13 >> 0x10 & 0xff) * 1000) / 0xff,
                 (ulong)((uVar13 >> 8 & 0xff) * 1000) / 0xff,(ulong)((uVar13 & 0xff) * 1000) / 0xff)
      ;
      init_pair((int)sVar29,7,(int)(short)(sVar29 + 7));
      lVar15 = lVar15 + 4;
      sVar29 = sVar29 + 1;
    } while (lVar15 != 0x40);
  }
  raw();
  keypad(_stdscr,1);
  noecho();
  wtimeout(_stdscr,0x32);
  curs_set(0);
  set_escdelay(0x19);
  pcVar16 = getcwd(auStack_1038,0x1001);
  sVar5 = sStack_1120._M_string_length;
  if (pcVar16 != (char *)0x0) {
    in_R8 = (char *)strlen(pcVar16);
    std::__cxx11::string::_M_replace((ulong)&sStack_1120,0,(char *)sVar5,(ulong)pcVar16);
  }
  auStack_1038._0_8_ = (WINDOW *)auStack_1028;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_1038,"tui","");
  IniProcessing::beginGroup(&configFile,(string *)auStack_1038);
  if ((WINDOW *)auStack_1038._0_8_ != (WINDOW *)auStack_1028) {
    operator_delete((void *)auStack_1038._0_8_);
  }
  IniProcessingVariant::IniProcessingVariant(&IStack_12b8,&sStack_1120);
  IniProcessing::value
            ((IniProcessingVariant *)auStack_1038,&configFile,"bank_directory",&IStack_12b8);
  IniProcessingVariant::toString_abi_cxx11_(&sStack_10b8,(IniProcessingVariant *)auStack_1038);
  std::__cxx11::string::operator=((string *)&sStack_1120,(string *)&sStack_10b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_10b8._M_dataplus._M_p != &sStack_10b8.field_2) {
    operator_delete(sStack_10b8._M_dataplus._M_p);
  }
  if ((WINDOW *)auStack_1038._0_8_ != (WINDOW *)auStack_1028) {
    operator_delete((void *)auStack_1038._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)IStack_12b8.m_data._M_dataplus._M_p != &IStack_12b8.m_data.field_2) {
    operator_delete(IStack_12b8.m_data._M_dataplus._M_p);
  }
  IniProcessing::endGroup(&configFile);
  setup_display((TUI_context *)auStack_1258);
  pcVar16 = (char *)gettext("Ready!");
  std::__cxx11::string::string((string *)apuStack_1058,pcVar16,(allocator *)auStack_1038);
  std::__cxx11::string::operator=((string *)&_Stack_1158,(string *)apuStack_1058);
  bStack_1138 = false;
  uStack_1134 = 10;
  if (apuStack_1058[0] != auStack_1048) {
    operator_delete(apuStack_1058[0]);
  }
  lStack_12c8 = std::chrono::_V2::steady_clock::now();
  do {
    if (((bool)auStack_1258[0] != false) || (bVar9 = interface_interrupted(), bVar9)) {
      memset(auStack_1038,0,0xf8);
      lVar15 = 0x48;
      do {
        *(undefined8 *)(auStack_1038 + lVar15) = 0;
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x58);
      lVar15 = 0x58;
      do {
        *(undefined8 *)(auStack_1038 + lVar15) = 0;
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0xd8);
      _Stack_f50._M_t.super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
      super__Head_base<0UL,__win_st_*,_false>._M_head_impl =
           (tuple<_win_st_*,_WINDOW_deleter>)(_Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>)0x0;
      _Stack_f48._M_t.super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
      super__Head_base<0UL,__win_st_*,_false>._M_head_impl =
           (tuple<_win_st_*,_WINDOW_deleter>)(_Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>)0x0;
      _Stack_f60._M_t.super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
      super__Head_base<0UL,__win_st_*,_false>._M_head_impl =
           (tuple<_win_st_*,_WINDOW_deleter>)(_Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>)0x0;
      _Stack_f58._M_t.super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
      super__Head_base<0UL,__win_st_*,_false>._M_head_impl =
           (tuple<_win_st_*,_WINDOW_deleter>)(_Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>)0x0;
      TUI_windows::operator=((TUI_windows *)(auStack_1258 + 8),(TUI_windows *)auStack_1038);
      TUI_windows::~TUI_windows((TUI_windows *)auStack_1038);
      endwin();
      bVar9 = interface_interrupted();
      if (bVar9) {
        curses_interface_exec();
      }
      if ((_Head_base<0UL,_char_*,_false>)_Stack_10d8._M_head_impl !=
          (_Head_base<0UL,_char_*,_false>)0x0) {
        operator_delete__(_Stack_10d8._M_head_impl);
      }
      _Stack_10d8._M_head_impl = (char *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_1120._M_dataplus._M_p != &sStack_1120.field_2) {
        operator_delete(sStack_1120._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_1158._M_p != &aStack_1148) {
        operator_delete(_Stack_1158._M_p);
      }
      TUI_windows::~TUI_windows((TUI_windows *)(auStack_1258 + 8));
      return;
    }
    if (p_Stack_12c0 != (_func_void_void_ptr *)0x0) {
      (*p_Stack_12c0)(pvStack_1288);
    }
    handle_notifications((TUI_context *)auStack_1258);
    if ((ulong)active_emulator_id == 0xffffffff) {
      _Var17._M_head_impl = (Player *)0x0;
    }
    else {
      _Var17._M_head_impl =
           player[emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>._M_impl
                  .super__Vector_impl_data._M_start[active_emulator_id].player]._M_t.
           super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
           super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
           super__Head_base<0UL,_Player_*,_false>._M_head_impl;
    }
    if ((Player *)CONCAT44(uStack_1124,uStack_1128) != _Var17._M_head_impl) {
      uStack_1128 = SUB84(_Var17._M_head_impl,0);
      uStack_1124 = (undefined4)((ulong)_Var17._M_head_impl >> 0x20);
      update_bank_mtime((TUI_context *)auStack_1258);
    }
    lVar18 = std::chrono::_V2::steady_clock::now();
    lVar15 = lStack_12c8;
    if ((1000000000 < lVar18 - lStack_12c8) &&
       (bVar9 = update_bank_mtime((TUI_context *)auStack_1258), lVar15 = lVar18, bVar9)) {
      if ((ulong)active_emulator_id == 0xffffffff) {
        uVar25 = 0;
      }
      else {
        uVar25 = (ulong)emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                        _M_impl.super__Vector_impl_data._M_start[active_emulator_id].player;
      }
      bVar9 = Player::dynamic_load_bank
                        ((Player *)CONCAT44(uStack_1124,uStack_1128),
                         player_bank_file_abi_cxx11_[uVar25]._M_dataplus._M_p);
      if (bVar9) {
        pcVar16 = (char *)gettext("Bank has changed on disk. Reload!");
        std::__cxx11::string::string((string *)apuStack_1078,pcVar16,(allocator *)auStack_1038);
        std::__cxx11::string::operator=((string *)&_Stack_1158,(string *)apuStack_1078);
        bStack_1138 = false;
        uStack_1134 = 10;
        puVar27 = apuStack_1078[0];
        if (apuStack_1078[0] != auStack_1068) {
LAB_00118547:
          uStack_1134 = 10;
          bStack_1138 = false;
          operator_delete(puVar27);
        }
      }
      else {
        pcVar16 = (char *)gettext("Bank has changed on disk. Reloading failed.");
        std::__cxx11::string::string((string *)apuStack_1098,pcVar16,(allocator *)auStack_1038);
        std::__cxx11::string::operator=((string *)&_Stack_1158,(string *)apuStack_1098);
        bStack_1138 = false;
        uStack_1134 = 10;
        puVar27 = apuStack_1098[0];
        if (apuStack_1098[0] != auStack_1088) goto LAB_00118547;
      }
    }
    lStack_12c8 = lVar15;
    uVar23 = auStack_1258._8_8_;
    pPVar4 = (Player *)CONCAT44(uStack_1124,uStack_1128);
    if ((_win_st *)auStack_1258._8_8_ != (_win_st *)0x0) {
      get_program_title_abi_cxx11_();
      uVar19 = auStack_1038._8_8_;
      wattr_on(uVar23,0x200400,0);
      in_R8 = (char *)0x2d;
      in_R9 = (char *)0x2d;
      wborder(uVar23,0x20,0x20,0x2d,0x2d,0x2d,0x2d,0x2d,0x2d);
      wattr_off(uVar23,0x200400,0);
      iVar10 = -1;
      if (_stdscr != 0) {
        iVar10 = *(short *)(_stdscr + 6) + 1;
      }
      iVar11 = -1;
      if (_stdscr != 0) {
        iVar11 = (int)*(short *)(_stdscr + 10);
      }
      psVar1 = (short *)(uVar19 + 2);
      if (psVar1 <= (char *)(ulong)(uint)(iVar10 - iVar11)) {
        wattr_on(uVar23,0x200400,0);
        uVar25 = (ulong)((long)(ulong)(uint)(iVar10 - iVar11) - (long)psVar1) >> 1;
        iVar10 = wmove(uVar23,0,uVar25 & 0xffffffff);
        if (iVar10 != -1) {
          waddch(uVar23,0x28);
        }
        iVar10 = (int)uVar25;
        iVar11 = wmove(uVar23,0,iVar10 + (int)uVar19 + 1);
        if (iVar11 != -1) {
          waddch(uVar23,0x29);
        }
        wattr_off(uVar23,0x200400,0);
        iVar10 = wmove(uVar23,0,iVar10 + 1);
        if (iVar10 != -1) {
          waddnstr(uVar23,auStack_1038._0_8_,0xffffffff);
        }
      }
      wnoutrefresh(uVar23);
      if ((WINDOW *)auStack_1038._0_8_ != (WINDOW *)auStack_1028) {
        operator_delete((void *)auStack_1038._0_8_);
      }
    }
    uVar23 = auStack_1258._24_8_;
    if ((_win_st *)auStack_1258._24_8_ != (_win_st *)0x0) {
      iVar10 = wmove(auStack_1258._24_8_,0,0);
      if (iVar10 != -1) {
        uVar19 = gettext("Player");
        waddnstr(uVar23,uVar19,0xffffffff);
      }
      if (pPVar4 != (Player *)0x0) {
        wattr_on(uVar23,0x200,0);
        PVar12 = (*pPVar4->_vptr_Player[3])(pPVar4);
        in_R8 = Player::name(PVar12);
        PVar12 = (*pPVar4->_vptr_Player[3])(pPVar4);
        in_R9 = Player::version(PVar12);
        mvwprintw(uVar23,0,0xf,"%s %s");
        wattr_off(uVar23,0x200,0);
      }
      wclrtoeol(uVar23);
      wnoutrefresh(uVar23);
    }
    uVar23 = auStack_1258._32_8_;
    if ((_Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>)auStack_1258._32_8_ != (_win_st *)0x0) {
      iVar10 = wmove(auStack_1258._32_8_,0,0);
      if (iVar10 != -1) {
        uVar19 = gettext("Emulator");
        waddnstr(uVar23,uVar19,0xffffffff);
      }
      if (pPVar4 != (Player *)0x0) {
        wattr_on(uVar23,0x200,0);
        iVar10 = wmove(uVar23,0,0xf);
        if (iVar10 != -1) {
          iVar10 = (*pPVar4->_vptr_Player[6])(pPVar4);
          waddnstr(uVar23,iVar10,0xffffffff);
        }
        wattr_off(uVar23,0x200,0);
      }
      wclrtoeol(uVar23);
      wnoutrefresh(uVar23);
    }
    uVar23 = auStack_1258._40_8_;
    if ((_win_st *)auStack_1258._40_8_ != (_win_st *)0x0) {
      iVar10 = wmove(auStack_1258._40_8_,0,0);
      if (iVar10 != -1) {
        uVar19 = gettext("Chips");
        waddnstr(uVar23,uVar19,0xffffffff);
      }
      if (pPVar4 != (Player *)0x0) {
        wattr_on(uVar23,0x200,0);
        uVar13 = (*pPVar4->_vptr_Player[10])(pPVar4);
        in_R8 = (char *)(ulong)uVar13;
        mvwprintw(uVar23,0,0xf,"%u");
        wattr_off(uVar23,0x200,0);
        waddnstr(uVar23," * ",0xffffffff);
        wattr_on(uVar23,0x200,0);
        PVar12 = (*pPVar4->_vptr_Player[3])(pPVar4);
        pcVar16 = Player::chip_name(PVar12);
        waddnstr(uVar23,pcVar16,0xffffffff);
        wattr_off(uVar23,0x200,0);
      }
      wclrtoeol(uVar23);
      wnoutrefresh(uVar23);
    }
    uVar23 = auStack_1258._48_8_;
    if ((_win_st *)auStack_1258._48_8_ != (_win_st *)0x0) {
      iVar10 = wmove(auStack_1258._48_8_,0,0);
      if (iVar10 != -1) {
        uVar19 = gettext("CPU");
        waddnstr(uVar23,uVar19,0xffffffff);
      }
      print_bar((WINDOW *)uVar23,0xf,0xf,0x200,cpuratio,(char)in_R8,(char)in_R9,
                in_stack_ffffffffffffed08);
      wclrtoeol(uVar23);
      wnoutrefresh(uVar23);
    }
    uVar23 = auStack_1258._56_8_;
    if ((_win_st *)auStack_1258._56_8_ != (_win_st *)0x0) {
      iVar10 = wmove(auStack_1258._56_8_,0,0);
      if (iVar10 != -1) {
        uVar19 = gettext("Bank");
        waddnstr(uVar23,uVar19,0xffffffff);
      }
      if (pPVar4 != (Player *)0x0) {
        auStack_1038._8_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
        auStack_1028._0_4_ = auStack_1028._0_4_ & 0xffffff00;
        if ((ulong)active_emulator_id == 0xffffffff) {
          uVar25 = 0;
        }
        else {
          uVar25 = (ulong)emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>
                          ._M_impl.super__Vector_impl_data._M_start[active_emulator_id].player;
        }
        auStack_1038._0_8_ = (WINDOW *)auStack_1028;
        if (player_bank_file_abi_cxx11_[uVar25]._M_string_length == 0) {
          pcVar16 = (char *)gettext("(default)");
          uVar19 = auStack_1038._8_8_;
          in_R8 = (char *)strlen(pcVar16);
          std::__cxx11::string::_M_replace((ulong)auStack_1038,0,(char *)uVar19,(ulong)pcVar16);
        }
        else {
          psVar26 = player_bank_file_abi_cxx11_ + uVar25;
          lVar15 = std::__cxx11::string::rfind((char)psVar26,0x2f);
          if (lVar15 == -1) {
            IStack_12b8.m_data._M_dataplus._M_p = (pointer)&IStack_12b8.m_data.field_2;
            pcVar3 = (psVar26->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&IStack_12b8,pcVar3,
                       pcVar3 + player_bank_file_abi_cxx11_[uVar25]._M_string_length);
          }
          else {
            std::__cxx11::string::substr((ulong)&IStack_12b8,(ulong)psVar26);
          }
          std::__cxx11::string::_M_assign((string *)auStack_1038);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)IStack_12b8.m_data._M_dataplus._M_p != &IStack_12b8.m_data.field_2) {
            operator_delete(IStack_12b8.m_data._M_dataplus._M_p);
          }
        }
        wattr_on(uVar23,0x200,0);
        iVar10 = wmove(uVar23,0,0xf);
        if (iVar10 != -1) {
          waddnstr(uVar23,auStack_1038._0_8_,0xffffffff);
        }
        wattr_off(uVar23,0x200,0);
        if ((WINDOW *)auStack_1038._0_8_ != (WINDOW *)auStack_1028) {
          operator_delete((void *)auStack_1038._0_8_);
        }
      }
      wclrtoeol(uVar23);
      wnoutrefresh(uVar23);
    }
    uVar23 = auStack_1258._64_8_;
    if ((_win_st *)auStack_1258._64_8_ != (_win_st *)0x0) {
      iVar10 = wmove(auStack_1258._64_8_,0,0);
      if (iVar10 != -1) {
        uVar19 = gettext("Alloc mode");
        waddnstr(uVar23,uVar19,0xffffffff);
      }
      if (pPVar4 != (Player *)0x0) {
        wattr_on(uVar23,0x200,0);
        iVar10 = wmove(uVar23,0,0xf);
        if (iVar10 != -1) {
          pcVar16 = Player::get_channel_alloc_mode_name(pPVar4);
          waddnstr(uVar23,pcVar16,0xffffffff);
        }
        wattr_off(uVar23,0x200,0);
      }
      wclrtoeol(uVar23);
      wnoutrefresh(uVar23);
    }
    auStack_1038._4_4_ = lvcurrent[0]._4_4_;
    auStack_1038._0_4_ = lvcurrent[0]._0_4_;
    auStack_1038._12_4_ = lvcurrent[1]._4_4_;
    auStack_1038._8_4_ = lvcurrent[1]._0_4_;
    IStack_12b8.m_data._M_dataplus._M_p = (pointer)gettext("Left");
    IStack_12b8.m_data._M_string_length = gettext("Right");
    uVar23 = auStack_1258._72_8_;
    if ((_win_st *)auStack_1258._72_8_ != (_win_st *)0x0) {
      iVar10 = wmove(auStack_1258._72_8_,0,0);
      if (iVar10 != -1) {
        uVar19 = gettext("Volume");
        waddnstr(uVar23,uVar19,0xffffffff);
      }
      wattr_on(uVar23,0x200,0);
      in_R8 = (char *)(ulong)(uint)player_volume;
      mvwprintw(uVar23,0,0xf,"%3d%%\n");
      wattr_off(uVar23,0x200,0);
      wclrtoeol(uVar23);
      wrefresh(uVar23);
    }
    lVar15 = 0;
    do {
      pWVar21 = *(WINDOW **)(auStack_1258 + (lVar15 + -2) * 8 + 0x60);
      if (pWVar21 != (WINDOW *)0x0) {
        dStack_1260 = *(double *)(auStack_1038 + lVar15 * 8);
        iVar10 = wmove(pWVar21,0,0);
        if (iVar10 != -1) {
          waddnstr(pWVar21,(&IStack_12b8.m_data._M_dataplus)[lVar15]._M_p,0xffffffff);
        }
        print_bar(pWVar21,7,((int)pWVar21->_maxx - (int)pWVar21->_begx) + -6,0x200500,dStack_1260,
                  (char)in_R8,(char)in_R9,in_stack_ffffffffffffed08);
        wclrtoeol(pWVar21);
        wnoutrefresh(pWVar21);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 == 1);
    pPVar28 = channel_map;
    lVar15 = 0;
    do {
      lVar18 = *(long *)(auStack_1258 + lVar15 * 8 + 0x60);
      if (lVar18 != 0) {
        in_R8 = (char *)(ulong)((int)lVar15 + 1);
        mvwprintw(lVar18,0,0,"%2u: [");
        wattr_on(lVar18,&uleb128_00200800,0);
        wprintw(lVar18,"%3u",pPVar28->gm);
        wattr_off(lVar18,&uleb128_00200800,0);
        waddnstr(lVar18,"]",0xffffffff);
        uVar13 = midi_channel_note_count[lVar15];
        wattr_on(lVar18,&DWORD_00200500,0);
        iVar10 = wmove(lVar18,0,0xb);
        if (iVar10 != -1) {
          uVar23 = 0x2a;
          if (uVar13 == 0) {
            uVar23 = 0x20;
          }
          waddch(lVar18,uVar23);
        }
        wattr_off(lVar18,&DWORD_00200500,0);
        if (lVar15 == 9) {
          uStack_10f0 = uStack_10f0 + 1;
          if ((uStack_10f0 == 10) && (uStack_10f0 = 0, midi_channel_last_note_p1[9] != 0)) {
            uVar13 = midi_channel_last_note_p1[9] - 1;
            bStack_10ec = true;
            MStack_10e8 = midi_db.midi_perc_[uVar13].spec;
            uStack_10e4 = *(undefined4 *)&midi_db.midi_perc_[uVar13].field_0x4;
            pcStack_10e0 = midi_db.midi_perc_[uVar13].name;
          }
          pcVar16 = pcStack_10e0;
          spec = MStack_10e8;
          if (bStack_10ec == false) {
            pcVar16 = (char *)gettext("Percussion");
            spec = GM;
          }
        }
        else {
          if ((pPVar28->bank_lsb == 0 && pPVar28->bank_msb == 0) ||
             (pMVar20 = Midi_Db::find_ex(&midi_db,pPVar28->bank_msb,pPVar28->bank_lsb,pPVar28->gm),
             pMVar20 == (Midi_Program_Ex *)0x0)) {
            spec = GM;
            pcVar16 = (char *)0x0;
          }
          else {
            spec = pMVar20->spec;
            pcVar16 = pMVar20->name;
          }
          if (pcVar16 == (char *)0x0) {
            pcVar16 = midi_db.midi_inst_[pPVar28->gm];
          }
        }
        uVar2 = (&DAT_001983a0)[spec];
        wattr_on(lVar18,uVar2,0);
        iVar10 = wmove(lVar18,0,0xc);
        if (iVar10 != -1) {
          waddnstr(lVar18,pcVar16,0xffffffff);
        }
        wattr_off(lVar18,uVar2,0);
        if (spec != GM) {
          pcVar16 = midi_spec_name(spec);
          wprintw(lVar18," [%s]",pcVar16);
        }
        wclrtoeol(lVar18);
        wrefresh(lVar18);
      }
      uVar23 = auStack_1258._224_8_;
      lVar15 = lVar15 + 1;
      pPVar28 = pPVar28 + 1;
    } while (lVar15 != 0x10);
    if (((_win_st *)auStack_1258._224_8_ != (_win_st *)0x0) && (sStack_1150 != 0)) {
      if (bStack_1138 == false) {
        wattr_on(auStack_1258._224_8_,0x300,0);
        iVar10 = wmove(uVar23,0,0);
        if (iVar10 != -1) {
          waddnstr(uVar23,_Stack_1158._M_p,0xffffffff);
        }
        wattr_off(uVar23,0x300,0);
        uVar19 = std::chrono::_V2::steady_clock::now();
        uStack_1130 = (undefined4)uVar19;
        uStack_112c = (undefined4)((ulong)uVar19 >> 0x20);
        bStack_1138 = true;
        wclrtoeol(uVar23);
      }
      else {
        lVar15 = std::chrono::_V2::steady_clock::now();
        if (lVar15 - CONCAT44(uStack_112c,uStack_1130) <= (long)((ulong)uStack_1134 * 1000000000))
        goto LAB_0011900f;
        sStack_1150 = 0;
        *_Stack_1158._M_p = '\0';
        bStack_1138 = false;
        werase(uVar23);
      }
      wnoutrefresh(uVar23);
    }
LAB_0011900f:
    uVar23 = auStack_1258._232_8_;
    if ((_Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>)auStack_1258._232_8_ != (_win_st *)0x0) {
      if (update_display(TUI_context&)::keydesc == '\0') {
        curses_interface_exec();
      }
      uVar25 = 0;
      do {
        wmove(uVar23,0,uVar25 & 0xffffffff);
        wattr_on(uVar23,0x600,0);
        waddnstr(uVar23,*(undefined8 *)((long)&update_display(TUI_context&)::keydesc + uVar25),
                 0xffffffff);
        wattr_off(uVar23,0x600,0);
        waddnstr(uVar23," ",0xffffffff);
        waddnstr(uVar23,*(undefined8 *)((long)&DAT_002222f8 + uVar25),0xffffffff);
        uVar25 = uVar25 + 0x10;
      } while (uVar25 != 0x50);
      wclrtoeol(uVar23);
      wnoutrefresh(uVar23);
    }
    uVar23 = auStack_1258._240_8_;
    if ((_win_st *)auStack_1258._240_8_ != (_win_st *)0x0) {
      if (update_display(TUI_context&)::keydesc == '\0') {
        curses_interface_exec();
      }
      uVar25 = 0;
      do {
        wmove(uVar23,0,uVar25 & 0xffffffff);
        wattr_on(uVar23,0x600,0);
        waddnstr(uVar23,*(undefined8 *)((long)&update_display(TUI_context&)::keydesc + uVar25),
                 0xffffffff);
        wattr_off(uVar23,0x600,0);
        waddnstr(uVar23," ",0xffffffff);
        waddnstr(uVar23,*(undefined8 *)((long)&DAT_00222358 + uVar25),0xffffffff);
        uVar25 = uVar25 + 0x10;
      } while (uVar25 != 0x50);
      wclrtoeol(uVar23);
      wnoutrefresh(uVar23);
    }
    uVar23 = auStack_1258._248_8_;
    if ((_win_st *)auStack_1258._248_8_ != (_win_st *)0x0) {
      if (update_display(TUI_context&)::keydesc == '\0') {
        curses_interface_exec();
      }
      wmove(uVar23,0,0);
      wattr_on(uVar23,0x600,0);
      waddnstr(uVar23,update_display(TUI_context&)::keydesc,0xffffffff);
      wattr_off(uVar23,0x600,0);
      waddnstr(uVar23," ",0xffffffff);
      waddnstr(uVar23,DAT_002223b8,0xffffffff);
      wclrtoeol(uVar23);
      wnoutrefresh(uVar23);
    }
    iVar10 = wgetch(_stdscr);
    bVar9 = handle_anylevel_key((TUI_context *)auStack_1258,iVar10);
    if ((bVar9) || (pPVar4 = (Player *)CONCAT44(uStack_1124,uStack_1128), pPVar4 == (Player *)0x0))
    goto switchD_00119258_caseD_3d;
    if (0x4f < iVar10) {
      switch(iVar10) {
      case 0x5b:
        uVar13 = (*pPVar4->_vptr_Player[10])(pPVar4);
        if (1 < uVar13) {
          Player::dynamic_set_chip_count(pPVar4,uVar13 - 1);
          auStack_1028[4] = 'h';
          auStack_1028._0_4_ = 0x746e7973;
          auStack_1038._8_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x5;
          auStack_1028[5] = '\0';
          auStack_1038._0_8_ = (WINDOW *)auStack_1028;
          IniProcessing::beginGroup(&configFile,(string *)auStack_1038);
          goto joined_r0x00119a01;
        }
        break;
      case 0x5c:
      case 0x5e:
      case 0x5f:
      case 0x60:
        break;
      case 0x5d:
        iVar10 = (*pPVar4->_vptr_Player[10])(pPVar4);
        Player::dynamic_set_chip_count(pPVar4,iVar10 + 1);
        auStack_1028[4] = 'h';
        auStack_1028._0_4_ = 0x746e7973;
        auStack_1038._8_8_ = (_win_st *)0x5;
        auStack_1028[5] = '\0';
        auStack_1038._0_8_ = (WINDOW *)auStack_1028;
        IniProcessing::beginGroup(&configFile,(string *)auStack_1038);
joined_r0x00119a01:
        if ((WINDOW *)auStack_1038._0_8_ != (WINDOW *)auStack_1028) {
          operator_delete((void *)auStack_1038._0_8_);
        }
        PVar12 = (*pPVar4->_vptr_Player[10])(pPVar4);
        pcVar16 = "nchip";
LAB_00119aae:
        IniProcessing::setValue(&configFile,pcVar16,PVar12);
        goto LAB_00119abc;
      case 0x61:
        goto switchD_00119258_caseD_41;
      case 0x62:
        goto switchD_00119258_caseD_42;
      case 99:
        goto switchD_00119258_caseD_43;
      default:
        if ((iVar10 == 0x50) || (iVar10 == 0x70)) {
          Player::dynamic_panic(pPVar4);
        }
      }
      goto switchD_00119258_caseD_3d;
    }
    switch(iVar10) {
    case 0x3c:
      if (active_emulator_id != 0) {
        dynamic_switch_emulator_id(active_emulator_id - 1);
        auStack_1028[4] = 'h';
        auStack_1028._0_4_ = 0x746e7973;
        auStack_1038._8_8_ = (_win_st *)0x5;
        auStack_1028[5] = '\0';
        auStack_1038._0_8_ = (WINDOW *)auStack_1028;
        IniProcessing::beginGroup(&configFile,(string *)auStack_1038);
        if ((WINDOW *)auStack_1038._0_8_ != (WINDOW *)auStack_1028) {
          operator_delete((void *)auStack_1038._0_8_);
        }
        IniProcessing::setValue(&configFile,"emulator",pPVar4->emulator_);
LAB_00119978:
        if (active_emulator_id == 0xffffffff) {
          PVar12 = OPL3;
        }
        else {
          PVar12 = emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                   _M_impl.super__Vector_impl_data._M_start[active_emulator_id].player;
        }
        pcVar16 = "pt";
        goto LAB_00119aae;
      }
      break;
    case 0x3d:
    case 0x3f:
    case 0x40:
      break;
    case 0x3e:
      uVar13 = active_emulator_id + 1;
      uVar25 = ((long)emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      if (uVar13 <= uVar25 && uVar25 - uVar13 != 0) {
        dynamic_switch_emulator_id(uVar13);
        auStack_1028[4] = 'h';
        auStack_1028._0_4_ = 0x746e7973;
        auStack_1038._8_8_ = (_win_st *)0x5;
        auStack_1028[5] = '\0';
        auStack_1038._0_8_ = (WINDOW *)auStack_1028;
        IniProcessing::beginGroup(&configFile,(string *)auStack_1038);
        if ((WINDOW *)auStack_1038._0_8_ != (WINDOW *)auStack_1028) {
          operator_delete((void *)auStack_1038._0_8_);
        }
        IniProcessing::setValue(&configFile,"emulator",pPVar4->emulator_);
        goto LAB_00119978;
      }
      break;
    case 0x41:
switchD_00119258_caseD_41:
      iVar11 = (*pPVar4->_vptr_Player[0xf])(pPVar4);
      iVar10 = iVar11 + 1;
      if (1 < iVar11) {
        iVar10 = -1;
      }
      Player::dynamic_set_channel_alloc(pPVar4,iVar10);
      auStack_1028[4] = 'h';
      auStack_1028._0_4_ = 0x746e7973;
      auStack_1038._8_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x5;
      auStack_1028[5] = '\0';
      auStack_1038._0_8_ = (WINDOW *)auStack_1028;
      IniProcessing::beginGroup(&configFile,(string *)auStack_1038);
      if ((WINDOW *)auStack_1038._0_8_ != (WINDOW *)auStack_1028) {
        operator_delete((void *)auStack_1038._0_8_);
      }
      pcVar16 = "chanalloc";
      goto LAB_00119a95;
    case 0x42:
switchD_00119258_caseD_42:
      erase();
      auStack_1038._8_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
      auStack_1028._0_4_ = auStack_1028._0_4_ & 0xffffff00;
      auStack_1028._16_8_ = &aStack_1008;
      _Stack_1010._M_head_impl = (_win_st *)0x0;
      aStack_1008._M_local_buf[0] = false;
      aStack_ff8._M_allocated_capacity = (size_type)&aStack_fe8;
      aStack_ff8._8_8_ = (char *)0x0;
      aStack_fe8._M_local_buf[0] = '\0';
      bStack_fd8 = false;
      auStack_1038._0_8_ = (WINDOW *)auStack_1028;
      pcVar16 = (char *)gettext("Load bank");
      uVar23 = aStack_ff8._8_8_;
      strlen(pcVar16);
      std::__cxx11::string::_M_replace((ulong)&aStack_ff8,0,(char *)uVar23,(ulong)pcVar16);
      std::__cxx11::string::_M_assign((string *)auStack_1038);
      File_Selector::File_Selector
                ((File_Selector *)&stack0xffffffffffffed08,(File_Selection_Options *)auStack_1038);
      _Stack_12d0._M_head_impl = (_win_st *)derwin(_stdscr,_LINES,_COLS,0,0);
      File_Selector::setup_display
                ((File_Selector *)&stack0xffffffffffffed08,_Stack_12d0._M_head_impl);
      File_Selector::update((File_Selector *)&stack0xffffffffffffed08);
      pvVar7 = pvStack_10c0;
      p_Var6 = p_Stack_10c8;
      iVar10 = wgetch(_stdscr);
      FVar14 = Continue;
      while (((bool)auStack_1258[0] == false &&
             (bVar9 = interface_interrupted(), FVar14 == Continue && !bVar9))) {
        if (p_Var6 != (_func_void_void_ptr *)0x0) {
          (*p_Var6)(pvVar7);
        }
        handle_notifications((TUI_context *)auStack_1258);
        bVar9 = handle_anylevel_key((TUI_context *)auStack_1258,iVar10);
        if (bVar9) {
          FVar14 = Continue;
          if (iVar10 == 0x19a) {
            pWVar21 = (WINDOW *)derwin(_stdscr,_LINES,_COLS,0,0);
            bVar9 = _Stack_12d0._M_head_impl != (WINDOW *)0x0;
            _Stack_12d0._M_head_impl = pWVar21;
            if (bVar9) {
              delwin();
            }
            File_Selector::setup_display
                      ((File_Selector *)&stack0xffffffffffffed08,_Stack_12d0._M_head_impl);
          }
        }
        else {
          FVar14 = File_Selector::key((File_Selector *)&stack0xffffffffffffed08,iVar10);
          File_Selector::update((File_Selector *)&stack0xffffffffffffed08);
        }
        doupdate();
        iVar10 = wgetch(_stdscr);
      }
      if (FVar14 == Ok) {
        bVar9 = Player::dynamic_load_bank(pPVar4,(char *)auStack_1028._16_8_);
        if (bVar9) {
          pcVar16 = (char *)gettext("Bank loaded!");
          std::__cxx11::string::string((string *)&IStack_12b8,pcVar16,(allocator *)&sStack_12f0);
          std::__cxx11::string::operator=((string *)&_Stack_1158,(string *)&IStack_12b8);
          bStack_1138 = false;
          uStack_1134 = 10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)IStack_12b8.m_data._M_dataplus._M_p != &IStack_12b8.m_data.field_2) {
            operator_delete(IStack_12b8.m_data._M_dataplus._M_p);
          }
          if ((ulong)active_emulator_id == 0xffffffff) {
            uVar25 = 0;
          }
          else {
            uVar25 = (ulong)emulator_ids.
                            super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>._M_impl.
                            super__Vector_impl_data._M_start[active_emulator_id].player;
          }
          std::__cxx11::string::_M_assign((string *)(player_bank_file_abi_cxx11_ + uVar25));
          update_bank_mtime((TUI_context *)auStack_1258);
        }
        else {
          pcVar16 = (char *)gettext("Error loading the bank file.");
          std::__cxx11::string::string((string *)&sStack_10b8,pcVar16,(allocator *)&sStack_12f0);
          std::__cxx11::string::operator=((string *)&_Stack_1158,(string *)&sStack_10b8);
          bStack_1138 = false;
          uStack_1134 = 10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_10b8._M_dataplus._M_p != &sStack_10b8.field_2) {
            operator_delete(sStack_10b8._M_dataplus._M_p);
          }
        }
        std::__cxx11::string::_M_assign((string *)&sStack_1120);
      }
      sStack_12f0._M_string_length = 3;
      sStack_12f0.field_2._M_allocated_capacity._0_4_ = 0x697574;
      sStack_12f0._M_dataplus._M_p = (pointer)&sStack_12f0.field_2;
      IniProcessing::beginGroup(&configFile,&sStack_12f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_12f0._M_dataplus._M_p != &sStack_12f0.field_2) {
        operator_delete(sStack_12f0._M_dataplus._M_p);
      }
      IniProcessing::setValue(&configFile,"bank_directory",&sStack_1120);
      psVar26 = player_bank_file_abi_cxx11_;
      lVar15 = 0;
      do {
        pcStack_1280 = acStack_1270;
        std::__cxx11::string::_M_construct((ulong)&pcStack_1280,'\x01');
        std::__detail::__to_chars_10_impl<unsigned_int>(pcStack_1280,uStack_1278,(uint)lVar15);
        in_R8 = (char *)0x9;
        plVar22 = (long *)std::__cxx11::string::replace((ulong)&pcStack_1280,0,(char *)0x0,0x19855c)
        ;
        sStack_12f0._M_dataplus._M_p = (pointer)&sStack_12f0.field_2;
        psVar24 = (size_type *)(plVar22 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar22 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar24) {
          sStack_12f0.field_2._M_allocated_capacity = *psVar24;
          sStack_12f0.field_2._8_8_ = plVar22[3];
        }
        else {
          sStack_12f0.field_2._M_allocated_capacity = *psVar24;
          sStack_12f0._M_dataplus._M_p = (pointer)*plVar22;
        }
        sStack_12f0._M_string_length = plVar22[1];
        *plVar22 = (long)psVar24;
        plVar22[1] = 0;
        *(undefined1 *)(plVar22 + 2) = 0;
        if (pcStack_1280 != acStack_1270) {
          operator_delete(pcStack_1280);
        }
        IniProcessing::setValue(&configFile,sStack_12f0._M_dataplus._M_p,psVar26);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_12f0._M_dataplus._M_p != &sStack_12f0.field_2) {
          operator_delete(sStack_12f0._M_dataplus._M_p);
        }
        lVar15 = lVar15 + 1;
        psVar26 = psVar26 + 1;
      } while (lVar15 == 1);
      IniProcessing::endGroup(&configFile);
      IniProcessing::writeIniFile(&configFile);
      erase();
      std::unique_ptr<_win_st,_WINDOW_deleter>::~unique_ptr
                ((unique_ptr<_win_st,_WINDOW_deleter> *)&_Stack_12d0);
      File_Selector::~File_Selector((File_Selector *)&stack0xffffffffffffed08);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)aStack_ff8._M_allocated_capacity != &aStack_fe8) {
        operator_delete((void *)aStack_ff8._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_1028._16_8_ != &aStack_1008) {
        operator_delete((void *)auStack_1028._16_8_);
      }
      if ((WINDOW *)auStack_1038._0_8_ != (WINDOW *)auStack_1028) {
        operator_delete((void *)auStack_1038._0_8_);
      }
      break;
    case 0x43:
switchD_00119258_caseD_43:
      erase();
      in_R8 = (char *)0x0;
      auStack_1038._0_8_ = derwin(_stdscr,_LINES,_COLS,0);
      Channel_Monitor::Channel_Monitor((Channel_Monitor *)&sStack_12f0);
      Channel_Monitor::setup_display((Channel_Monitor *)&sStack_12f0,(WINDOW *)auStack_1038._0_8_);
      Channel_Monitor::setup_player((Channel_Monitor *)&sStack_12f0,pPVar4);
      Channel_Monitor::update
                ((Channel_Monitor *)&sStack_12f0,_Stack_10d8._M_head_impl,(uint)uStack_10d0,
                 uStack_10d0._4_4_);
      pvVar7 = pvStack_10c0;
      p_Var6 = p_Stack_10c8;
      iVar10 = wgetch(_stdscr);
      iVar11 = 1;
      while (((bool)auStack_1258[0] == false &&
             (bVar9 = interface_interrupted(), !bVar9 && 0 < iVar11))) {
        if (p_Var6 != (_func_void_void_ptr *)0x0) {
          (*p_Var6)(pvVar7);
        }
        handle_notifications((TUI_context *)auStack_1258);
        bVar9 = handle_anylevel_key((TUI_context *)auStack_1258,iVar10);
        if (bVar9) {
          if (iVar10 == 0x19a) {
            in_R8 = (char *)0x0;
            pWVar21 = (WINDOW *)derwin(_stdscr,_LINES,_COLS,0);
            bVar9 = (WINDOW *)auStack_1038._0_8_ != (WINDOW *)0x0;
            auStack_1038._0_8_ = pWVar21;
            if (bVar9) {
              delwin();
            }
            Channel_Monitor::setup_display
                      ((Channel_Monitor *)&sStack_12f0,(WINDOW *)auStack_1038._0_8_);
          }
        }
        else {
          iVar11 = Channel_Monitor::key((Channel_Monitor *)&sStack_12f0,iVar10);
          Channel_Monitor::update
                    ((Channel_Monitor *)&sStack_12f0,_Stack_10d8._M_head_impl,(uint)uStack_10d0,
                     uStack_10d0._4_4_);
        }
        doupdate();
        iVar10 = wgetch(_stdscr);
      }
      erase();
      Channel_Monitor::~Channel_Monitor((Channel_Monitor *)&sStack_12f0);
      std::unique_ptr<_win_st,_WINDOW_deleter>::~unique_ptr
                ((unique_ptr<_win_st,_WINDOW_deleter> *)auStack_1038);
      break;
    default:
      if (iVar10 == 0x2a) {
        if (0x1f2 < player_volume) {
          player_volume = 499;
        }
        player_volume = player_volume + 1;
        auStack_1028[4] = 'h';
        auStack_1028._0_4_ = 0x746e7973;
        auStack_1038._8_8_ = (_win_st *)0x5;
        auStack_1028[5] = '\0';
        auStack_1038._0_8_ = (WINDOW *)auStack_1028;
        IniProcessing::beginGroup(&configFile,(string *)auStack_1038);
      }
      else {
        if (iVar10 != 0x2f) break;
        if (player_volume < 2) {
          player_volume = 1;
        }
        player_volume = player_volume + -1;
        auStack_1028[4] = 'h';
        auStack_1028._0_4_ = 0x746e7973;
        auStack_1038._8_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x5;
        auStack_1028[5] = '\0';
        auStack_1038._0_8_ = (WINDOW *)auStack_1028;
        IniProcessing::beginGroup(&configFile,(string *)auStack_1038);
      }
      if ((WINDOW *)auStack_1038._0_8_ != (WINDOW *)auStack_1028) {
        operator_delete((void *)auStack_1038._0_8_);
      }
      pcVar16 = "volume";
      iVar10 = player_volume;
LAB_00119a95:
      IniProcessing::setValue(&configFile,pcVar16,iVar10);
LAB_00119abc:
      IniProcessing::endGroup(&configFile);
      IniProcessing::writeIniFile(&configFile);
    }
switchD_00119258_caseD_3d:
    doupdate();
  } while( true );
}

Assistant:

void interface_exec(void(*idle_proc)(void *), void *idle_data)
{
#if defined(ADLJACK_USE_CURSES)
    if (arg_simple_interface)
        simple_interface_exec(idle_proc, idle_data);
    else
        curses_interface_exec(idle_proc, idle_data);
#else
    simple_interface_exec();
#endif
}